

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

int __thiscall
ON_ModelComponent::CompareName(ON_ModelComponent *this,ON_UUID *other_parent_id,wchar_t *other_name)

{
  bool bVar1;
  int iVar2;
  wchar_t *name1;
  
  bVar1 = UniqueNameIncludesParent(this->m_component_type);
  if (((bVar1) && ((this->m_set_status & 0x20) != 0)) &&
     (iVar2 = ON_UuidCompare(&this->m_component_parent_id,other_parent_id), iVar2 != 0)) {
    return iVar2;
  }
  Name((ON_ModelComponent *)&stack0xffffffffffffffd8);
  name1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffd8);
  iVar2 = ON_wString::CompareAttributeName(name1,other_name);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
  return iVar2;
}

Assistant:

int ON_ModelComponent::CompareName(
  const ON_UUID& other_parent_id,
  const wchar_t* other_name
  ) const
{
  int rc
    = (ON_ModelComponent::UniqueNameIncludesParent(m_component_type) && NameIsSet())
    ? ON_UuidCompare(m_component_parent_id, other_parent_id)
    : 0;
  return
    (0 != rc)
    ? rc
    : ON_wString::CompareAttributeName(Name(), other_name);
}